

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O1

Am_Wrapper * cmd_from_dialog_proc(Am_Object *self)

{
  Am_Wrapper *pAVar1;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  Am_Object::Get_Object(&local_10,(Am_Slot_Key)self,10);
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)&local_10,0x68);
  Am_Object::Get_Object(&local_18,(Am_Slot_Key)&local_20,0xc5);
  pAVar1 = Am_Object::operator_cast_to_Am_Wrapper_(&local_18);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_10);
  return pAVar1;
}

Assistant:

Am_Define_Object_Formula(cmd_from_dialog)
{
  // the window is the widget
  return self.Get_Owner().Get_Object(Am_WINDOW).Get_Object(Am_COMMAND);
}